

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_queue.h
# Opt level: O2

void b_queue_push(b_queue_t *p,uint Value)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  unsigned_long uVar5;
  
  uVar2 = p->size;
  if (uVar2 == p->cap) {
    uVar1 = p->i_first;
    uVar3 = (ulong)uVar1;
    if (uVar1 != p->i_empty) {
      __assert_fail("p->i_first == p->i_empty",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/b_queue.h"
                    ,0x30,"void b_queue_push(b_queue_t *, unsigned int)");
    }
    puVar4 = p->data;
    uVar5 = p->sum - (ulong)puVar4[uVar3];
    p->i_first = (uVar1 + 1) % uVar2;
  }
  else {
    p->size = uVar2 + 1;
    uVar5 = p->sum;
    puVar4 = p->data;
    uVar3 = (ulong)p->i_empty;
  }
  p->sum = Value + uVar5;
  puVar4[uVar3] = Value;
  uVar2 = p->i_empty + 1;
  p->i_empty = uVar2;
  if (uVar2 == p->cap) {
    p->i_first = 0;
    p->i_empty = 0;
  }
  return;
}

Assistant:

static inline void b_queue_push(b_queue_t *p, unsigned Value)
{
    if (p->size == p->cap) {
        assert(p->i_first == p->i_empty);
        p->sum -= p->data[p->i_first];
        p->i_first = (p->i_first + 1) % p->cap;
    } else
        p->size++;

    p->sum += Value;
    p->data[p->i_empty] = Value;
    if ((++p->i_empty) == p->cap) {
        p->i_empty = 0;
        p->i_first = 0;
    }
}